

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O1

void read_children(Fl_Type *p,int paste)

{
  Fl_Type *pFVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Fl_Class_Type *this;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  char **ppcVar6;
  char *pcVar7;
  bool bVar8;
  int local_34;
  undefined4 extraout_var;
  
  Fl_Type::current = p;
  local_34 = paste;
  do {
    pcVar4 = read_word(0);
    do {
      if (pcVar4 == (char *)0x0) {
        bVar8 = true;
        if (local_34 == 0 && p != (Fl_Type *)0x0) {
          pcVar4 = "Missing \'}\'";
LAB_001989e4:
          bVar8 = true;
          read_error(pcVar4);
        }
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"}");
      if (iVar2 == 0) {
        bVar8 = true;
        if (p == (Fl_Type *)0x0) {
          pcVar4 = "Unexpected \'}\'";
          goto LAB_001989e4;
        }
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"Magic:");
      if (iVar2 == 0) {
        read_fdesign();
        bVar8 = true;
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"version");
      if (iVar2 == 0) {
        bVar8 = false;
        pcVar4 = read_word(0);
        read_version = strtod(pcVar4,(char **)0x0);
        if ((read_version <= 0.0) || (1.03041 < read_version)) {
          bVar8 = false;
          read_error("unknown version \'%s\'",pcVar4);
        }
        goto LAB_00198b54;
      }
      if ((p == (Fl_Type *)0x0) && (iVar2 = strcmp(pcVar4,"define_in_struct"), iVar2 == 0)) {
        p = Fl_Type_make("class");
        bVar8 = false;
        pcVar4 = read_word(0);
        Fl_Type::name(p,pcVar4);
        local_34 = 1;
        Fl_Type::current = p;
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"do_not_include_H_from_C");
      if (iVar2 == 0) {
        include_H_from_C = 0;
        pFVar1 = Fl_Type::current;
        goto LAB_00198b51;
      }
      iVar2 = strcmp(pcVar4,"use_FL_COMMAND");
      if (iVar2 == 0) {
        use_FL_COMMAND = 1;
        pFVar1 = Fl_Type::current;
        goto LAB_00198b51;
      }
      iVar2 = strcmp(pcVar4,"i18n_type");
      if (iVar2 == 0) {
        bVar8 = false;
        pcVar4 = read_word(0);
        i18n_type = atoi(pcVar4);
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"i18n_function");
      if (iVar2 == 0) {
        pcVar4 = read_word(0);
        pcVar4 = strdup(pcVar4);
        ppcVar6 = &i18n_function;
LAB_00198afb:
        bVar8 = false;
        *ppcVar6 = pcVar4;
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"i18n_file");
      if (iVar2 == 0) {
        pcVar4 = read_word(0);
        pcVar4 = strdup(pcVar4);
        ppcVar6 = &i18n_file;
        goto LAB_00198afb;
      }
      iVar2 = strcmp(pcVar4,"i18n_set");
      if (iVar2 == 0) {
        pcVar4 = read_word(0);
        pcVar4 = strdup(pcVar4);
        ppcVar6 = &i18n_set;
        goto LAB_00198afb;
      }
      iVar2 = strcmp(pcVar4,"i18n_include");
      if (iVar2 == 0) {
        pcVar4 = read_word(0);
        pcVar4 = strdup(pcVar4);
        ppcVar6 = &i18n_include;
        goto LAB_00198afb;
      }
      iVar3 = strcmp(pcVar4,"header_name");
      iVar2 = header_file_set;
      if (iVar3 == 0) {
        bVar8 = false;
        pcVar4 = read_word(0);
        if (iVar2 != 0) goto LAB_00198b54;
        pcVar4 = strdup(pcVar4);
        ppcVar6 = &header_file_name;
LAB_00198b4e:
        *ppcVar6 = pcVar4;
        pFVar1 = Fl_Type::current;
        goto LAB_00198b51;
      }
      iVar3 = strcmp(pcVar4,"code_name");
      iVar2 = code_file_set;
      if (iVar3 == 0) {
        bVar8 = false;
        pcVar4 = read_word(0);
        if (iVar2 == 0) {
          pcVar4 = strdup(pcVar4);
          ppcVar6 = &code_file_name;
          goto LAB_00198b4e;
        }
        goto LAB_00198b54;
      }
      iVar2 = strcmp(pcVar4,"snap");
      if (((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"gridx"), iVar2 == 0)) ||
         (iVar2 = strcmp(pcVar4,"gridy"), iVar2 == 0)) {
        bVar8 = false;
        read_word(0);
        goto LAB_00198b54;
      }
      this = (Fl_Class_Type *)Fl_Type_make(pcVar4);
      if (this == (Fl_Class_Type *)0x0) {
        read_error("Unknown word \"%s\"",pcVar4);
LAB_001988e3:
        iVar2 = 3;
      }
      else {
        pcVar4 = read_word(0);
        Fl_Type::name((Fl_Type *)this,pcVar4);
        pcVar4 = read_word(1);
        iVar2 = strcmp(pcVar4,"{");
        if ((iVar2 != 0) && (iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])(this), iVar2 != 0)
           ) {
          Fl_Class_Type::prefix(this,(this->super_Fl_Type).name_);
          Fl_Type::name((Fl_Type *)this,pcVar4);
          pcVar4 = read_word(1);
        }
        iVar2 = strcmp(pcVar4,"{");
        if (iVar2 == 0) {
          (this->super_Fl_Type).open_ = '\0';
          pcVar7 = read_word(0);
          while ((pcVar7 != (char *)0x0 && (iVar2 = strcmp(pcVar7,"}"), iVar2 != 0))) {
            (*(this->super_Fl_Type)._vptr_Fl_Type[0xe])(this,pcVar7);
            pcVar7 = read_word(0);
          }
          iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x16])();
          if (iVar2 == 0) goto LAB_001988e3;
          pcVar4 = read_word(1);
          iVar2 = strcmp(pcVar4,"{");
          if (iVar2 != 0) {
            iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[4])(this);
            uVar5 = CONCAT44(extraout_var_00,iVar2);
            pcVar7 = "Missing child list for %s\n";
            goto LAB_001988c1;
          }
          iVar2 = 0;
          read_children((Fl_Type *)this,0);
        }
        else {
          iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[4])(this);
          uVar5 = CONCAT44(extraout_var,iVar2);
          pcVar7 = "Missing property list for %s\n";
LAB_001988c1:
          read_error(pcVar7,uVar5);
          iVar2 = 4;
        }
      }
    } while (iVar2 == 4);
    pFVar1 = p;
    if (iVar2 == 0) {
LAB_00198b51:
      Fl_Type::current = pFVar1;
      bVar8 = false;
    }
    else {
      bVar8 = iVar2 - 1U < 2;
    }
LAB_00198b54:
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

static void read_children(Fl_Type *p, int paste) {
  Fl_Type::current = p;
  for (;;) {
    const char *c = read_word();
  REUSE_C:
    if (!c) {
      if (p && !paste) read_error("Missing '}'");
      break;
    }

    if (!strcmp(c,"}")) {
      if (!p) read_error("Unexpected '}'");
      break;
    }

    // this is the first word in a .fd file:
    if (!strcmp(c,"Magic:")) {
      read_fdesign();
      return;
    }

    if (!strcmp(c,"version")) {
      c = read_word();
      read_version = strtod(c,0);
      if (read_version<=0 || read_version>double(FL_VERSION+0.00001))
        read_error("unknown version '%s'",c);
      continue;
    }

    // back compatibility with Vincent Penne's original class code:
    if (!p && !strcmp(c,"define_in_struct")) {
      Fl_Type *t = Fl_Type_make("class");
      t->name(read_word());
      Fl_Type::current = p = t;
      paste = 1; // stops "missing }" error
      continue;
    }

    if (!strcmp(c,"do_not_include_H_from_C")) {
      include_H_from_C=0;
      goto CONTINUE;
    }
    if (!strcmp(c,"use_FL_COMMAND")) {
      use_FL_COMMAND=1;
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type")) {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_function")) {
      i18n_function = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_file")) {
      i18n_file = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_set")) {
      i18n_set = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_include")) {
      i18n_include = strdup(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"i18n_type"))
    {
      i18n_type = atoi(read_word());
      goto CONTINUE;
    }
    if (!strcmp(c,"header_name")) {
      if (!header_file_set) header_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c,"code_name")) {
      if (!code_file_set) code_file_name = strdup(read_word());
      else read_word();
      goto CONTINUE;
    }

    if (!strcmp(c, "snap") || !strcmp(c, "gridx") || !strcmp(c, "gridy")) {
      // grid settings are now global
      read_word();
      goto CONTINUE;
    }

    {Fl_Type *t = Fl_Type_make(c);
    if (!t) {
      read_error("Unknown word \"%s\"", c);
      continue;
    }
    t->name(read_word());

    c = read_word(1);
    if (strcmp(c,"{") && t->is_class()) {   // <prefix> <name>
      ((Fl_Class_Type*)t)->prefix(t->name());
      t->name(c);
      c = read_word(1);
    }

    if (strcmp(c,"{")) {
      read_error("Missing property list for %s\n",t->title());
      goto REUSE_C;
    }

    t->open_ = 0;
    for (;;) {
      const char *cc = read_word();
      if (!cc || !strcmp(cc,"}")) break;
      t->read_property(cc);
    }

    if (!t->is_parent()) continue;
    c = read_word(1);
    if (strcmp(c,"{")) {
      read_error("Missing child list for %s\n",t->title());
      goto REUSE_C;
    }
    read_children(t, 0);}
    Fl_Type::current = p;
  CONTINUE:;
  }
}